

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O2

void free_cache(VMEMcache *cache)

{
  int iVar1;
  char *__format;
  stat_t local_38;
  stat_t entries;
  stat_t heap_entries;
  stat_t dram;
  stat_t pool_ued;
  
  do {
    iVar1 = vmemcache_evict(cache,0,0);
  } while (iVar1 == 0);
  get_stat(cache,&local_38,VMEMCACHE_STAT_ENTRIES);
  get_stat(cache,&entries,VMEMCACHE_STAT_HEAP_ENTRIES);
  get_stat(cache,&heap_entries,VMEMCACHE_STAT_DRAM_SIZE_USED);
  get_stat(cache,&dram,VMEMCACHE_STAT_POOL_SIZE_USED);
  if (local_38 == 0) {
    if (heap_entries == 0) {
      if (dram == 0) {
        if (entries == 1) {
          return;
        }
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
                ,0x4f,"free_cache");
        dram = entries - 1;
        __format = "%llu heap entries were not merged";
      }
      else {
        fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
                "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
                ,0x4d,"free_cache");
        __format = "%llu bytes of pool memory were not freed";
      }
    }
    else {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
              ,0x4b,"free_cache");
      __format = "%llu bytes of DRAM memory were not freed";
      dram = heap_entries;
    }
  }
  else {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
            ,0x49,"free_cache");
    __format = "%llu entries were not freed";
    dram = local_38;
  }
  fprintf(_stderr,__format,dram);
  fputc(10,_stderr);
  abort();
}

Assistant:

static void
free_cache(VMEMcache *cache)
{
	/* evict all entries from the cache */
	while (vmemcache_evict(cache, NULL, 0) == 0)
		;

#ifdef STATS_ENABLED
	/* verify that all memory is freed */
	stat_t entries, heap_entries, dram, pool_ued;
	get_stat(cache, &entries, VMEMCACHE_STAT_ENTRIES);
	get_stat(cache, &heap_entries, VMEMCACHE_STAT_HEAP_ENTRIES);
	get_stat(cache, &dram, VMEMCACHE_STAT_DRAM_SIZE_USED);
	get_stat(cache, &pool_ued, VMEMCACHE_STAT_POOL_SIZE_USED);

	if (entries != 0)
		UT_FATAL("%llu entries were not freed", entries);
	if (dram != 0)
		UT_FATAL("%llu bytes of DRAM memory were not freed", dram);
	if (pool_ued != 0)
		UT_FATAL("%llu bytes of pool memory were not freed", pool_ued);
	if (heap_entries != 1)
		UT_FATAL("%llu heap entries were not merged", heap_entries - 1);
#endif /* STATS_ENABLED */
}